

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

Path * Path::resolved(Path *__return_storage_ptr__,String *path,ResolveMode mode,Path *cwd,bool *ok)

{
  pointer pcVar1;
  bool bVar2;
  
  (__return_storage_ptr__->super_String).mString._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_String).mString.field_2;
  pcVar1 = (path->mString)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (path->mString)._M_string_length);
  bVar2 = resolve(__return_storage_ptr__,mode,cwd,(bool *)0x0);
  if (ok != (bool *)0x0) {
    *ok = ok != (bool *)0x0 && bVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::resolved(const String &path, ResolveMode mode, const Path &cwd, bool *ok)
{
    Path ret(path);
    if (ret.resolve(mode, cwd) && ok) {
        *ok = true;
    } else if (ok) {
        *ok = false;
    }
    return ret;
}